

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsvg.c
# Opt level: O3

FT_Error ft_svg_transform(FT_Renderer_conflict renderer,FT_GlyphSlot slot,FT_Matrix *_matrix,
                         FT_Vector *_delta)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  FT_Pos *pFVar7;
  FT_Matrix b;
  FT_Matrix a;
  FT_Pos local_98;
  undefined1 local_90 [16];
  FT_Fixed FStack_80;
  FT_Fixed local_78;
  FT_Fixed FStack_70;
  FT_Matrix local_68;
  FT_Matrix local_48;
  
  pFVar7 = &local_98;
  if (_matrix == (FT_Matrix *)0x0) {
    _matrix = &local_48;
    local_48.xx = 0x10000;
    local_48.xy = 0;
    local_48.yx = 0;
    local_48.yy = 0x10000;
  }
  pvVar1 = slot->other;
  if (_delta == (FT_Vector *)0x0) {
    _delta = (FT_Vector *)local_90;
    local_90._0_8_ = 0;
    local_98 = 0;
  }
  else {
    pFVar7 = &_delta->y;
  }
  local_68.yx = *(FT_Fixed *)((long)pvVar1 + 0x60);
  local_68.yy = *(FT_Fixed *)((long)pvVar1 + 0x68);
  local_68.xx = *(FT_Fixed *)((long)pvVar1 + 0x50);
  local_68.xy = *(FT_Fixed *)((long)pvVar1 + 0x58);
  local_90._8_8_ = _matrix->xx;
  FStack_80 = _matrix->xy;
  local_78 = _matrix->yx;
  FStack_70 = _matrix->yy;
  FT_Matrix_Multiply((FT_Matrix *)(local_90 + 8),&local_68);
  lVar3 = (long)(int)_matrix->xx * (long)*(int *)((long)pvVar1 + 0x70);
  lVar4 = (long)(int)_matrix->xy * (long)*(int *)((long)pvVar1 + 0x78);
  lVar5 = (long)(int)_matrix->yx * (long)*(int *)((long)pvVar1 + 0x70);
  lVar6 = (long)(int)_matrix->yy * (long)*(int *)((long)pvVar1 + 0x78);
  lVar2 = *pFVar7;
  *(long *)((long)pvVar1 + 0x70) =
       (long)(int)((ulong)(lVar3 + 0x8000 + (lVar3 >> 0x3f)) >> 0x10) + _delta->x +
       (long)(int)((ulong)(lVar4 + 0x8000 + (lVar4 >> 0x3f)) >> 0x10);
  *(long *)((long)pvVar1 + 0x78) =
       (int)((ulong)(lVar5 + 0x8000 + (lVar5 >> 0x3f)) >> 0x10) + lVar2 +
       (long)(int)((ulong)(lVar6 + 0x8000 + (lVar6 >> 0x3f)) >> 0x10);
  *(FT_Fixed *)((long)pvVar1 + 0x50) = local_68.xx;
  *(FT_Fixed *)((long)pvVar1 + 0x58) = local_68.xy;
  *(FT_Fixed *)((long)pvVar1 + 0x60) = local_68.yx;
  *(FT_Fixed *)((long)pvVar1 + 0x68) = local_68.yy;
  return 0;
}

Assistant:

static FT_Error
  ft_svg_transform( FT_Renderer       renderer,
                    FT_GlyphSlot      slot,
                    const FT_Matrix*  _matrix,
                    const FT_Vector*  _delta )
  {
    FT_SVG_Document  doc    = (FT_SVG_Document)slot->other;
    FT_Matrix*       matrix = (FT_Matrix*)_matrix;
    FT_Vector*       delta  = (FT_Vector*)_delta;

    FT_Matrix  tmp_matrix;
    FT_Vector  tmp_delta;

    FT_Matrix  a, b;
    FT_Pos     x, y;


    FT_UNUSED( renderer );

    if ( !matrix )
    {
      tmp_matrix.xx = 0x10000;
      tmp_matrix.xy = 0;
      tmp_matrix.yx = 0;
      tmp_matrix.yy = 0x10000;

      matrix = &tmp_matrix;
    }

    if ( !delta )
    {
      tmp_delta.x = 0;
      tmp_delta.y = 0;

      delta = &tmp_delta;
    }

    a = doc->transform;
    b = *matrix;
    FT_Matrix_Multiply( &b, &a );


    x = ADD_LONG( ADD_LONG( FT_MulFix( matrix->xx, doc->delta.x ),
                            FT_MulFix( matrix->xy, doc->delta.y ) ),
                  delta->x );
    y = ADD_LONG( ADD_LONG( FT_MulFix( matrix->yx, doc->delta.x ),
                            FT_MulFix( matrix->yy, doc->delta.y ) ),
                  delta->y );

    doc->delta.x   = x;
    doc->delta.y   = y;
    doc->transform = a;

    return FT_Err_Ok;
  }